

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.cpp
# Opt level: O1

void create_ship_proc(Am_Object *command_obj)

{
  Am_Slot_Key AVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  Am_Value *pAVar5;
  Am_Wrapper *pAVar6;
  Am_Object *pAVar7;
  char *pcVar8;
  Am_Object new_ship;
  int y;
  int x;
  Am_Object AStack_58;
  Am_Object local_50;
  Am_Object local_48 [2];
  int local_38;
  int local_34;
  Am_Object local_30;
  
  pAVar5 = (Am_Value *)Am_Object::Get(0xe468,0x11f);
  iVar3 = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = (Am_Value *)Am_Object::Get(0xe468,0x120);
  iVar4 = Am_Value::operator_cast_to_int(pAVar5);
  Am_Translate_Coordinates(&SP_Clip_Win,iVar3,iVar4,&SP_Ship_Agg,&local_34,&local_38);
  pAVar5 = (Am_Value *)Am_Object::Get(0xe3d0,0x67);
  iVar3 = Am_Value::operator_cast_to_int(pAVar5);
  pcVar8 = "Klingon";
  if (iVar4 < iVar3 / 2) {
    pcVar8 = "Federation";
  }
  Am_Object::Create((char *)&local_30);
  uVar2 = Am_Object::Set((ushort)&local_30,(uint)SHIP_TYPE,(ulong)((iVar3 / 2 <= iVar4) + 1));
  uVar2 = Am_Object::Set(uVar2,100,(ulong)(local_34 - 10));
  uVar2 = Am_Object::Set(uVar2,0x65,(ulong)(local_38 - 10));
  AVar1 = TB_LIST;
  Am_Value_List::Am_Value_List((Am_Value_List *)local_48);
  pAVar6 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)local_48);
  pAVar7 = (Am_Object *)Am_Object::Add(uVar2,(Am_Wrapper *)(ulong)AVar1,(ulong)pAVar6);
  Am_Object::Am_Object(&AStack_58,pAVar7);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_48);
  Am_Object::~Am_Object(&local_30);
  Am_Object::Am_Object(&local_50,&AStack_58);
  Am_Object::Add_Part((Am_Object)0x10e3f0,SUB81(&local_50,0),1);
  Am_Object::~Am_Object(&local_50);
  Am_Object::Get_Object((ushort)local_48,(ulong)&AStack_58);
  Am_Object::Set((ushort)local_48,(char *)0xab,(ulong)pcVar8);
  Am_Object::~Am_Object(local_48);
  pAVar6 = Am_Object::operator_cast_to_Am_Wrapper_(&AStack_58);
  Am_Object::Set((ushort)command_obj,(Am_Wrapper *)0x169,(ulong)pAVar6);
  Am_Object::~Am_Object(&AStack_58);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, create_ship, (Am_Object command_obj))
{
  // Incoming coordinates are w.r.t. clip-win.  Translate them to short-agg.
  int clip_x = SP_Ship_Creator.Get(Am_FIRST_X);
  int clip_y = SP_Ship_Creator.Get(Am_FIRST_Y);
  int x, y;
  Am_Translate_Coordinates(SP_Clip_Win, clip_x, clip_y, SP_Ship_Agg, x, y);
  // SP_Trans_Clip_Ship_Coords (clip_x, clip_y, x, y);
  SP_Ship_Type ship_type;

  // Decide type of ship by whether event was in upper half or lower half
  // of clip window
  int l = SP_Clip_Win.Get(Am_HEIGHT);
  const char *ship_name;
  if (clip_y < (l / 2)) {
    ship_type = FEDERATION;
    ship_name = "Federation";
  } else {
    ship_type = KLINGON;
    ship_name = "Klingon";
  }

  Am_Object new_ship = SP_Ship.Create()
                           .Set(SHIP_TYPE, ship_type)
                           .Set(Am_LEFT, x - 10)
                           .Set(Am_TOP, y - 10)
                           .Add(TB_LIST, Am_Value_List());
  SP_Ship_Agg.Add_Part(new_ship);

  // Don't write a formula for SHIP_LABEL because it is set by
  // the text interactor.
  new_ship.Get_Object(SHIP_LABEL).Set(Am_TEXT, ship_name);

  // now set up for Undo
  command_obj.Set(Am_VALUE, new_ship);
  //  Am_Call(Am_Object_Proc, Am_Command, Am_DO_METHOD, (command_obj));
}